

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_copyCCtx_internal
                 (ZSTD_CCtx *dstCCtx,ZSTD_CCtx *srcCCtx,ZSTD_frameParameters fParams,
                 U64 pledgedSrcSize,ZSTD_buffered_policy_e zbuff)

{
  U32 UVar1;
  int iVar2;
  size_t sVar3;
  long local_140;
  long local_138;
  ZSTD_matchState_t *dstMatchState;
  ZSTD_matchState_t *srcMatchState;
  size_t h3Size;
  int h3log;
  size_t hSize;
  size_t chainSize;
  ZSTD_CCtx_params params;
  ZSTD_buffered_policy_e zbuff_local;
  U64 pledgedSrcSize_local;
  ZSTD_CCtx *srcCCtx_local;
  ZSTD_CCtx *dstCCtx_local;
  ZSTD_frameParameters fParams_local;
  
  if (srcCCtx->stage == ZSTDcs_init) {
    (dstCCtx->customMem).customAlloc = (srcCCtx->customMem).customAlloc;
    (dstCCtx->customMem).customFree = (srcCCtx->customMem).customFree;
    (dstCCtx->customMem).opaque = (srcCCtx->customMem).opaque;
    params.customMem.opaque._4_4_ = zbuff;
    memcpy(&chainSize,&dstCCtx->requestedParams,0xb0);
    chainSize._4_4_ = (srcCCtx->appliedParams).cParams.windowLog;
    unique0x00012004 = (srcCCtx->appliedParams).cParams.chainLog;
    params.cParams.windowLog = (srcCCtx->appliedParams).cParams.hashLog;
    params.cParams.chainLog = (srcCCtx->appliedParams).cParams.searchLog;
    params.cParams.hashLog = (srcCCtx->appliedParams).cParams.minMatch;
    params.cParams.searchLog = (srcCCtx->appliedParams).cParams.targetLength;
    params.cParams.minMatch = (srcCCtx->appliedParams).cParams.strategy;
    params.validateSequences = (srcCCtx->appliedParams).useRowMatchFinder;
    params.cParams._20_8_ = fParams._0_8_;
    params.fParams.contentSizeFlag = fParams.noDictIDFlag;
    ZSTD_resetCCtx_internal
              (dstCCtx,(ZSTD_CCtx_params *)&chainSize,pledgedSrcSize,0,ZSTDcrp_leaveDirty,
               params.customMem.opaque._4_4_);
    ZSTD_cwksp_mark_tables_dirty(&dstCCtx->workspace);
    iVar2 = ZSTD_allocateChainTable
                      ((srcCCtx->appliedParams).cParams.strategy,
                       (srcCCtx->appliedParams).useRowMatchFinder,0);
    if (iVar2 == 0) {
      local_138 = 0;
    }
    else {
      local_138 = 1L << ((byte)(srcCCtx->appliedParams).cParams.chainLog & 0x3f);
    }
    UVar1 = (srcCCtx->blockState).matchState.hashLog3;
    if (UVar1 == 0) {
      local_140 = 0;
    }
    else {
      local_140 = 1L << ((byte)UVar1 & 0x3f);
    }
    memcpy((dstCCtx->blockState).matchState.hashTable,(srcCCtx->blockState).matchState.hashTable,
           (1L << ((byte)(srcCCtx->appliedParams).cParams.hashLog & 0x3f)) << 2);
    memcpy((dstCCtx->blockState).matchState.chainTable,(srcCCtx->blockState).matchState.chainTable,
           local_138 << 2);
    memcpy((dstCCtx->blockState).matchState.hashTable3,(srcCCtx->blockState).matchState.hashTable3,
           local_140 << 2);
    ZSTD_cwksp_mark_tables_clean(&dstCCtx->workspace);
    memcpy(&(dstCCtx->blockState).matchState,&(srcCCtx->blockState).matchState,0x28);
    (dstCCtx->blockState).matchState.nextToUpdate = (srcCCtx->blockState).matchState.nextToUpdate;
    (dstCCtx->blockState).matchState.loadedDictEnd = (srcCCtx->blockState).matchState.loadedDictEnd;
    dstCCtx->dictID = srcCCtx->dictID;
    dstCCtx->dictContentSize = srcCCtx->dictContentSize;
    memcpy((dstCCtx->blockState).prevCBlock,(srcCCtx->blockState).prevCBlock,0x11f0);
    fParams_local.checksumFlag = 0;
    fParams_local.noDictIDFlag = 0;
  }
  else {
    fParams_local.checksumFlag = -0x3c;
    fParams_local.noDictIDFlag = -1;
  }
  sVar3._0_4_ = fParams_local.checksumFlag;
  sVar3._4_4_ = fParams_local.noDictIDFlag;
  return sVar3;
}

Assistant:

static size_t ZSTD_copyCCtx_internal(ZSTD_CCtx* dstCCtx,
                            const ZSTD_CCtx* srcCCtx,
                            ZSTD_frameParameters fParams,
                            U64 pledgedSrcSize,
                            ZSTD_buffered_policy_e zbuff)
{
    RETURN_ERROR_IF(srcCCtx->stage!=ZSTDcs_init, stage_wrong,
                    "Can't copy a ctx that's not in init stage.");
    DEBUGLOG(5, "ZSTD_copyCCtx_internal");
    ZSTD_memcpy(&dstCCtx->customMem, &srcCCtx->customMem, sizeof(ZSTD_customMem));
    {   ZSTD_CCtx_params params = dstCCtx->requestedParams;
        /* Copy only compression parameters related to tables. */
        params.cParams = srcCCtx->appliedParams.cParams;
        assert(srcCCtx->appliedParams.useRowMatchFinder != ZSTD_urm_auto);
        params.useRowMatchFinder = srcCCtx->appliedParams.useRowMatchFinder;
        params.fParams = fParams;
        ZSTD_resetCCtx_internal(dstCCtx, &params, pledgedSrcSize,
                                /* loadedDictSize */ 0,
                                ZSTDcrp_leaveDirty, zbuff);
        assert(dstCCtx->appliedParams.cParams.windowLog == srcCCtx->appliedParams.cParams.windowLog);
        assert(dstCCtx->appliedParams.cParams.strategy == srcCCtx->appliedParams.cParams.strategy);
        assert(dstCCtx->appliedParams.cParams.hashLog == srcCCtx->appliedParams.cParams.hashLog);
        assert(dstCCtx->appliedParams.cParams.chainLog == srcCCtx->appliedParams.cParams.chainLog);
        assert(dstCCtx->blockState.matchState.hashLog3 == srcCCtx->blockState.matchState.hashLog3);
    }

    ZSTD_cwksp_mark_tables_dirty(&dstCCtx->workspace);

    /* copy tables */
    {   size_t const chainSize = ZSTD_allocateChainTable(srcCCtx->appliedParams.cParams.strategy,
                                                         srcCCtx->appliedParams.useRowMatchFinder,
                                                         0 /* forDDSDict */)
                                    ? ((size_t)1 << srcCCtx->appliedParams.cParams.chainLog)
                                    : 0;
        size_t const hSize =  (size_t)1 << srcCCtx->appliedParams.cParams.hashLog;
        int const h3log = srcCCtx->blockState.matchState.hashLog3;
        size_t const h3Size = h3log ? ((size_t)1 << h3log) : 0;

        ZSTD_memcpy(dstCCtx->blockState.matchState.hashTable,
               srcCCtx->blockState.matchState.hashTable,
               hSize * sizeof(U32));
        ZSTD_memcpy(dstCCtx->blockState.matchState.chainTable,
               srcCCtx->blockState.matchState.chainTable,
               chainSize * sizeof(U32));
        ZSTD_memcpy(dstCCtx->blockState.matchState.hashTable3,
               srcCCtx->blockState.matchState.hashTable3,
               h3Size * sizeof(U32));
    }

    ZSTD_cwksp_mark_tables_clean(&dstCCtx->workspace);

    /* copy dictionary offsets */
    {
        const ZSTD_matchState_t* srcMatchState = &srcCCtx->blockState.matchState;
        ZSTD_matchState_t* dstMatchState = &dstCCtx->blockState.matchState;
        dstMatchState->window       = srcMatchState->window;
        dstMatchState->nextToUpdate = srcMatchState->nextToUpdate;
        dstMatchState->loadedDictEnd= srcMatchState->loadedDictEnd;
    }
    dstCCtx->dictID = srcCCtx->dictID;
    dstCCtx->dictContentSize = srcCCtx->dictContentSize;

    /* copy block state */
    ZSTD_memcpy(dstCCtx->blockState.prevCBlock, srcCCtx->blockState.prevCBlock, sizeof(*srcCCtx->blockState.prevCBlock));

    return 0;
}